

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cxx
# Opt level: O0

void __thiscall Fl_Input_Type::copy_properties(Fl_Input_Type *this)

{
  Fl_Input_ *this_00;
  Fl_Input_ *this_01;
  Fl_Font s_00;
  Fl_Fontsize s_01;
  Fl_Color n;
  int s_02;
  Fl_Input_ *s;
  Fl_Input_ *d;
  Fl_Input_Type *this_local;
  
  Fl_Widget_Type::copy_properties(&this->super_Fl_Widget_Type);
  this_00 = (Fl_Input_ *)(this->super_Fl_Widget_Type).live_widget;
  this_01 = (Fl_Input_ *)(this->super_Fl_Widget_Type).o;
  s_00 = Fl_Input_::textfont(this_01);
  Fl_Input_::textfont(this_00,s_00);
  s_01 = Fl_Input_::textsize(this_01);
  Fl_Input_::textsize(this_00,s_01);
  n = Fl_Input_::textcolor(this_01);
  Fl_Input_::textcolor(this_00,n);
  s_02 = Fl_Input_::shortcut(this_01);
  Fl_Input_::shortcut(this_00,s_02);
  return;
}

Assistant:

virtual void copy_properties() {
    Fl_Widget_Type::copy_properties();
    Fl_Input_ *d = (Fl_Input_*)live_widget, *s = (Fl_Input_*)o;
    d->textfont(s->textfont());
    d->textsize(s->textsize());
    d->textcolor(s->textcolor());
    d->shortcut(s->shortcut());
  }